

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextDisplayer.cpp
# Opt level: O0

void __thiscall TextDisplayer::drawCharacter(TextDisplayer *this,char character,GLint pixelSize)

{
  Character *pCVar1;
  bool **ppbVar2;
  int local_30;
  int local_2c;
  int j;
  int i;
  bool **charValues;
  float resetVal;
  GLint pixelSize_local;
  char character_local;
  TextDisplayer *this_local;
  
  pCVar1 = Alphabet::getChar(this->alphabet,(int)character);
  if (pCVar1 != (Character *)0x0) {
    pCVar1 = Alphabet::getChar(this->alphabet,(int)character);
    ppbVar2 = Character::getPixels(pCVar1);
    for (local_2c = 0; local_2c < 5; local_2c = local_2c + 1) {
      for (local_30 = 0; local_30 < 7; local_30 = local_30 + 1) {
        if ((ppbVar2[local_2c][local_30] & 1U) != 0) {
          PrimitiveDisplayer::drawSquare(this->primitiveDisplayer,(float)pixelSize);
        }
        glTranslatef(0,(float)pixelSize);
      }
      glTranslatef((float)pixelSize,(float)(pixelSize * -7),0);
    }
  }
  return;
}

Assistant:

void TextDisplayer::drawCharacter(char character, GLint pixelSize) {
    float resetVal = -Alphabet::CHARACTER_HEIGHT * pixelSize;
    if (alphabet->getChar(character)) {
        bool** charValues = alphabet->getChar(character)->getPixels();
        for (int i=0; i<Alphabet::CHARACTER_WIDTH; i++) {
            for (int j=0; j<Alphabet::CHARACTER_HEIGHT; j++) {
                if (charValues[i][j]) {
                    primitiveDisplayer->drawSquare(pixelSize);
                }
                glTranslatef(0.0f, pixelSize, 0.0f);
            }
            glTranslatef(pixelSize, resetVal, 0.0f);
        }
    }
}